

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O0

int efsw::String::strStartsWith(String *start,String *str)

{
  StringBaseType SVar1;
  StringBaseType SVar2;
  size_t sVar3;
  size_t sVar4;
  ulong local_30;
  size_t i;
  size_t size;
  int pos;
  String *str_local;
  String *start_local;
  
  size._4_4_ = -1;
  sVar3 = String::size(start);
  sVar4 = String::size(str);
  if (sVar3 <= sVar4) {
    for (local_30 = 0; local_30 < sVar3; local_30 = local_30 + 1) {
      SVar1 = operator[](start,local_30);
      SVar2 = operator[](str,local_30);
      if (SVar1 != SVar2) {
        return -1;
      }
      size._4_4_ = (int)local_30;
    }
  }
  return size._4_4_;
}

Assistant:

int String::strStartsWith( const String& start, const String& str ) {
	int pos = -1;
	size_t size = start.size();

	if ( str.size() >= size ) {
		for ( std::size_t i = 0; i < size; i++ ) {
			if ( start[i] == str[i] ) {
				pos = (int)i;
			} else {
				pos = -1;
				break;
			}
		}
	}

	return pos;
}